

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall
dap::json::JsonCppSerializer::array
          (JsonCppSerializer *this,size_t count,function<bool_(dap::Serializer_*)> *cb)

{
  bool bVar1;
  Value *json;
  undefined1 local_70 [8];
  JsonCppSerializer s;
  size_t i;
  function<bool_(dap::Serializer_*)> *local_28;
  function<bool_(dap::Serializer_*)> *cb_local;
  size_t count_local;
  JsonCppSerializer *this_local;
  
  local_28 = cb;
  cb_local = (function<bool_(dap::Serializer_*)> *)count;
  count_local = (size_t)this;
  Json::Value::Value((Value *)&i,arrayValue);
  Json::Value::operator=(this->json,(Value *)&i);
  Json::Value::~Value((Value *)&i);
  s.ownsJson = false;
  s.removed = false;
  s._18_6_ = 0;
  for (; (ulong)s._16_8_ < cb_local; s._16_8_ = s._16_8_ + 1) {
    json = Json::Value::operator[](this->json,s._16_4_);
    JsonCppSerializer((JsonCppSerializer *)local_70,json);
    bVar1 = std::function<bool_(dap::Serializer_*)>::operator()(local_28,(Serializer *)local_70);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    ~JsonCppSerializer((JsonCppSerializer *)local_70);
    if (!bVar1) goto LAB_00fb8b8a;
  }
  this_local._7_1_ = 1;
LAB_00fb8b8a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool JsonCppSerializer::array(size_t count,
                              const std::function<bool(dap::Serializer*)>& cb) {
  *json = Json::Value(Json::arrayValue);
  for (size_t i = 0; i < count; i++) {
    JsonCppSerializer s(&(*json)[Json::Value::ArrayIndex(i)]);
    if (!cb(&s)) {
      return false;
    }
  }
  return true;
}